

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Clause.cpp
# Opt level: O0

string * __thiscall Kernel::Clause::literalsOnlyToString_abi_cxx11_(Clause *this)

{
  long in_RSI;
  string *in_RDI;
  uint i;
  string *result;
  Literal *in_stack_000001d8;
  string local_70 [16];
  allocator<char> *in_stack_ffffffffffffffa0;
  char *in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  uint uVar1;
  string local_48 [35];
  undefined1 local_25;
  allocator<char> local_11 [17];
  
  if ((*(ulong *)(in_RSI + 0x38) & 0xfffff) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
               in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
    std::allocator<char>::~allocator(local_11);
  }
  else {
    local_25 = 0;
    std::__cxx11::string::string((string *)in_RDI);
    Literal::toString_abi_cxx11_(in_stack_000001d8);
    std::__cxx11::string::operator+=((string *)in_RDI,local_48);
    std::__cxx11::string::~string(local_48);
    for (uVar1 = 1; uVar1 < ((uint)*(undefined8 *)(in_RSI + 0x38) & 0xfffff); uVar1 = uVar1 + 1) {
      std::__cxx11::string::operator+=((string *)in_RDI," | ");
      Literal::toString_abi_cxx11_(in_stack_000001d8);
      std::__cxx11::string::operator+=((string *)in_RDI,local_70);
      std::__cxx11::string::~string(local_70);
    }
  }
  return in_RDI;
}

Assistant:

std::string Clause::literalsOnlyToString() const
{
  if (_length == 0) {
    return "$false";
  } else {
    std::string result;
    result += _literals[0]->toString();
    for(unsigned i = 1; i < _length; i++) {
      result += " | ";
      result += _literals[i]->toString();
    }
    return result;
  }
}